

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_quad_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  REF_INT edg [3];
  REF_INT cell;
  REF_INT node;
  REF_INT quad [5];
  int local_90;
  int local_8c;
  undefined4 local_88;
  REF_INT local_84;
  ulong local_80;
  REF_GRID_conflict local_78;
  double local_70;
  REF_DBL local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_48;
  REF_NODE local_40;
  ulong local_38;
  
  uVar16 = (ulong)(uint)dim;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      iVar6 = dim + -1;
      local_80 = uVar16;
      local_78 = pRVar1;
      if (0 < dim) {
        local_70 = 1.0 / (double)iVar6;
        lVar9 = 0;
        uVar5 = 0;
        do {
          local_68 = (double)(int)uVar5 * local_70 + 0.0;
          uVar15 = 0;
          local_38 = uVar5;
          do {
            uVar3 = ref_node_add(ref_node,uVar15 + lVar9,&local_5c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x7bd,"ref_fixture_quad_brick_grid",(ulong)uVar3,"node");
              return uVar3;
            }
            pRVar2 = ref_node->real;
            lVar7 = (long)local_5c;
            pRVar2[lVar7 * 0xf] = (double)(int)uVar15 * local_70 + 0.0;
            pRVar2[lVar7 * 0xf + 1] = local_68;
            pRVar2[lVar7 * 0xf + 2] = 0.0;
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
          uVar5 = local_38 + 1;
          lVar9 = lVar9 + uVar16;
        } while (uVar5 != uVar16);
      }
      local_88 = 1;
      iVar13 = 0;
      if (0 < iVar6) {
        iVar13 = iVar6;
      }
      iVar14 = 0;
      local_40 = ref_node;
      while (iVar13 != iVar14) {
        local_90 = iVar14;
        local_8c = iVar14 + 1;
        uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
        iVar14 = iVar14 + 1;
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7c9,"ref_fixture_quad_brick_grid",(ulong)uVar3,"qua");
          return uVar3;
        }
      }
      local_88 = 2;
      iVar13 = iVar13 + 1;
      iVar11 = (int)local_80 * 2 + -1;
      uVar3 = 0;
      iVar14 = iVar6;
      while (iVar13 = iVar13 + -1, iVar13 != 0) {
        local_90 = iVar14;
        local_8c = iVar11;
        uVar4 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7d1,"ref_fixture_quad_brick_grid",(ulong)uVar4,"edg");
          uVar3 = uVar4;
        }
        iVar14 = iVar14 + (int)local_80;
        iVar11 = iVar11 + (int)local_80;
        if (uVar4 != 0) {
          return uVar3;
        }
      }
      local_88 = 3;
      iVar13 = (int)local_80;
      if (1 < iVar13) {
        iVar14 = iVar13 * iVar13 + -2;
        iVar13 = iVar6;
        do {
          local_90 = iVar14 + 1;
          local_8c = iVar14;
          uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x7d9,"ref_fixture_quad_brick_grid",(ulong)uVar3,"edg");
            return uVar3;
          }
          iVar13 = iVar13 + -1;
          iVar14 = iVar14 + -1;
        } while (0 < iVar13);
      }
      local_88 = 4;
      iVar13 = (int)local_80;
      if (1 < iVar13) {
        iVar11 = (iVar13 + -2) * iVar13;
        iVar12 = iVar13 * iVar6;
        iVar14 = iVar6;
        do {
          local_90 = iVar12;
          local_8c = iVar11;
          uVar3 = ref_cell_add(local_78->cell[0],&local_90,&local_84);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x7e1,"ref_fixture_quad_brick_grid",(ulong)uVar3,"edg");
            return uVar3;
          }
          iVar14 = iVar14 + -1;
          iVar13 = (int)local_80;
          iVar11 = iVar11 - iVar13;
          iVar12 = iVar12 - iVar13;
        } while (0 < iVar14);
      }
      local_48 = 1;
      iVar14 = iVar13;
      if (1 < iVar13) {
        iVar11 = 0;
        local_70 = (double)((ulong)local_70 & 0xffffffff00000000);
        do {
          local_68 = (REF_DBL)CONCAT44(local_68._4_4_,iVar11);
          iVar14 = iVar6;
          while( true ) {
            bVar17 = iVar14 == 0;
            iVar14 = iVar14 + -1;
            if (bVar17) break;
            local_50 = iVar11 + iVar13 + 1;
            local_4c = iVar11 + (int)local_80;
            local_58 = iVar11;
            local_54 = iVar11 + 1;
            uVar3 = ref_cell_add(local_78->cell[6],&local_58,&local_84);
            iVar11 = iVar11 + 1;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x7ec,"ref_fixture_quad_brick_grid",(ulong)uVar3,"qua");
              return uVar3;
            }
          }
          iVar12 = local_70._0_4_ + 1;
          iVar11 = local_68._0_4_ + (int)local_80;
          local_70 = (double)CONCAT44(local_70._4_4_,iVar12);
          iVar14 = (int)local_80;
        } while (iVar12 != iVar6);
      }
      uVar3 = ref_node_initialize_n_global(local_40,(ulong)(uint)(iVar14 * iVar14));
      if (uVar3 == 0) {
        return 0;
      }
      pcVar10 = "init glob";
      uVar8 = 0x7f0;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      pcVar10 = "init glob";
      uVar8 = 0x7ab;
    }
  }
  else {
    pcVar10 = "create";
    uVar8 = 0x7a4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_quad_brick_grid",(ulong)uVar3,pcVar10);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_quad_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], quad[5];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  quad[4] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      quad[0] = ij2node(i, j, m, n);
      quad[1] = ij2node(i + 1, j, m, n);
      quad[2] = ij2node(i + 1, j + 1, m, n);
      quad[3] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}